

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnAtomicWaitExpr
          (BinaryReaderInterp *this,Opcode opcode,uint32_t align_log2,Address offset)

{
  Result RVar1;
  Address alignment;
  
  alignment = 0xffffffff;
  if (align_log2 < 0x20) {
    alignment = 1 << ((byte)align_log2 & 0x1f);
  }
  RVar1 = SharedValidator::OnAtomicWait
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     opcode,alignment);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,opcode.enum_,0,offset);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnAtomicWaitExpr(Opcode opcode,
                                            uint32_t align_log2,
                                            Address offset) {
  CHECK_RESULT(validator_.OnAtomicWait(loc, opcode, GetAlignment(align_log2)));
  istream_.Emit(opcode, kMemoryIndex0, offset);
  return Result::Ok;
}